

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O2

void aom_ifft_2d_gen(float *input,float *temp,float *output,int n,aom_fft_1d_func_t fft_single,
                    aom_fft_1d_func_t fft_multi,aom_fft_1d_func_t ifft_multi,
                    aom_fft_transpose_func_t transpose,int vec_size)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  int y;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  float *pfVar20;
  int x_2;
  long lVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  float *local_80;
  
  iVar1 = n / 2;
  lVar12 = (long)iVar1;
  uVar2 = iVar1 + 1;
  lVar5 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  iVar14 = n * 2;
  lVar23 = (long)n;
  iVar16 = 0;
  while (bVar24 = uVar8 != 0, uVar8 = uVar8 - 1, bVar24) {
    *(float *)((long)output + lVar5) = input[iVar16];
    *(undefined4 *)((long)output + lVar5 + 4) =
         *(undefined4 *)((long)input + lVar5 * 2 + lVar12 * 8);
    iVar16 = iVar16 + iVar14;
    lVar5 = lVar5 + lVar23 * 4;
  }
  lVar5 = lVar12 + 1;
  iVar16 = iVar14 + 1;
  lVar3 = lVar5 * lVar23 * 4;
  lVar17 = 0;
  for (lVar19 = lVar5; lVar19 < lVar23; lVar19 = lVar19 + 1) {
    *(float *)((long)output + lVar17 + lVar3) = input[iVar16];
    *(undefined4 *)((long)output + lVar17 + lVar3 + 4) =
         *(undefined4 *)((long)input + lVar17 * 2 + (lVar12 + lVar23) * 8 + 4);
    iVar16 = iVar16 + iVar14;
    lVar17 = lVar17 + lVar23 * 4;
  }
  lVar3 = (long)vec_size;
  pfVar6 = temp;
  pfVar7 = output;
  for (lVar19 = 0; lVar19 < 2; lVar19 = lVar19 + lVar3) {
    (*ifft_multi)(pfVar7,pfVar6,n);
    pfVar7 = pfVar7 + lVar3;
    pfVar6 = pfVar6 + lVar3;
  }
  uVar4 = 0;
  uVar8 = 0;
  if (0 < n) {
    uVar8 = (ulong)(uint)n;
  }
  pfVar6 = output + 2;
  iVar14 = iVar1;
  for (; lVar19 = 1, uVar4 != uVar8; uVar4 = uVar4 + 1) {
    for (; lVar17 = 1, lVar19 < lVar12; lVar19 = lVar19 + 1) {
      pfVar6[lVar19 + -1] = input[lVar19 * 2];
    }
    for (; lVar17 < lVar12; lVar17 = lVar17 + 1) {
      output[iVar14 + (int)lVar17] = input[lVar17 * 2 + 1];
    }
    input = input + lVar23 * 2;
    pfVar6 = pfVar6 + lVar23;
    iVar14 = iVar14 + n;
  }
  pfVar6 = temp + 2;
  pfVar7 = output + 2;
  for (lVar19 = 2; lVar19 < lVar3; lVar19 = lVar19 + 1) {
    (*fft_single)(pfVar7,pfVar6,n);
    pfVar6 = pfVar6 + 1;
    pfVar7 = pfVar7 + 1;
  }
  uVar4 = 2;
  if (2 < vec_size) {
    uVar4 = (ulong)(uint)vec_size;
  }
  pfVar6 = output + uVar4;
  pfVar7 = temp + uVar4;
  for (; (long)uVar4 < lVar23; uVar4 = uVar4 + lVar3) {
    (*fft_multi)(pfVar6,pfVar7,n);
    pfVar6 = pfVar6 + lVar3;
    pfVar7 = pfVar7 + lVar3;
  }
  pfVar6 = temp + 1;
  for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    output[uVar4] = pfVar6[-1];
    output[(long)(iVar1 * n) + uVar4] = *pfVar6;
    pfVar6 = pfVar6 + lVar23;
  }
  pfVar7 = output + lVar23;
  pfVar6 = temp + 2;
  lVar15 = (lVar23 + -1) * lVar23;
  lVar19 = lVar15 * 4 + lVar12 * 4;
  lVar9 = ((lVar23 + -1) - lVar12) * lVar23;
  lVar17 = lVar9 * 4 + 8;
  pfVar18 = output + lVar5 * lVar23;
  local_80 = temp + lVar12 * lVar23 + 2;
  pfVar20 = temp + lVar12 + 1;
  lVar13 = lVar9 * 4 + 4 + lVar12 * 4;
  lVar9 = lVar15 * 4 + 8;
  lVar15 = 1;
  while (lVar19 = lVar19 + 4, lVar15 < lVar12) {
    lVar15 = lVar15 + 1;
    pfVar11 = pfVar6;
    for (uVar8 = 0; pfVar10 = temp, lVar21 = lVar5, uVar2 != uVar8; uVar8 = uVar8 + 1) {
      fVar25 = 0.0;
      if ((long)uVar8 < lVar12 && uVar8 != 0) {
        fVar25 = *(float *)((long)pfVar11 + (lVar23 * 4 + 4) * lVar12 + -4);
      }
      pfVar7[uVar8] = fVar25 + *pfVar11;
      pfVar11 = pfVar11 + lVar23;
    }
    for (; lVar21 < lVar23; lVar21 = lVar21 + 1) {
      pfVar7[lVar21] = *(float *)((long)pfVar10 + lVar17) - *(float *)((long)pfVar10 + lVar19);
      pfVar10 = pfVar10 + -lVar23;
    }
    lVar21 = 0;
    for (uVar8 = 0; pfVar11 = temp, lVar22 = lVar5, uVar2 != uVar8; uVar8 = uVar8 + 1) {
      fVar25 = 0.0;
      if ((long)uVar8 < lVar12 && uVar8 != 0) {
        fVar25 = local_80[lVar21];
      }
      pfVar18[uVar8] = pfVar20[lVar21] - fVar25;
      lVar21 = lVar21 + lVar23;
    }
    for (; lVar22 < lVar23; lVar22 = lVar22 + 1) {
      pfVar18[lVar22] = *(float *)((long)pfVar11 + lVar9) + *(float *)((long)pfVar11 + lVar13);
      pfVar11 = pfVar11 + -lVar23;
    }
    pfVar7 = pfVar7 + lVar23;
    pfVar6 = pfVar6 + 1;
    lVar17 = lVar17 + 4;
    pfVar18 = pfVar18 + lVar23;
    local_80 = local_80 + 1;
    pfVar20 = pfVar20 + 1;
    lVar13 = lVar13 + 4;
    lVar9 = lVar9 + 4;
  }
  pfVar6 = temp;
  pfVar7 = output;
  for (lVar5 = 0; lVar5 < lVar23; lVar5 = lVar5 + lVar3) {
    (*ifft_multi)(pfVar7,pfVar6,n);
    pfVar7 = pfVar7 + lVar3;
    pfVar6 = pfVar6 + lVar3;
  }
  (*transpose)(temp,output,n);
  return;
}

Assistant:

void aom_ifft_2d_gen(const float *input, float *temp, float *output, int n,
                     aom_fft_1d_func_t fft_single, aom_fft_1d_func_t fft_multi,
                     aom_fft_1d_func_t ifft_multi,
                     aom_fft_transpose_func_t transpose, int vec_size) {
  // Column 0 and n/2 have conjugate symmetry, so we can directly do the ifft
  // and get real outputs.
  for (int y = 0; y <= n / 2; ++y) {
    output[y * n] = input[2 * y * n];
    output[y * n + 1] = input[2 * (y * n + n / 2)];
  }
  for (int y = n / 2 + 1; y < n; ++y) {
    output[y * n] = input[2 * (y - n / 2) * n + 1];
    output[y * n + 1] = input[2 * ((y - n / 2) * n + n / 2) + 1];
  }

  for (int i = 0; i < 2; i += vec_size) {
    ifft_multi(output + i, temp + i, n);
  }

  // For the other columns, since we don't have a full ifft for complex inputs
  // we have to split them into the real and imaginary counterparts.
  // Pack the real component, then the imaginary components.
  for (int y = 0; y < n; ++y) {
    for (int x = 1; x < n / 2; ++x) {
      output[y * n + (x + 1)] = input[2 * (y * n + x)];
    }
    for (int x = 1; x < n / 2; ++x) {
      output[y * n + (x + n / 2)] = input[2 * (y * n + x) + 1];
    }
  }
  for (int y = 2; y < vec_size; y++) {
    fft_single(output + y, temp + y, n);
  }
  // This is the part that can be sped up with SIMD
  for (int y = AOMMAX(2, vec_size); y < n; y += vec_size) {
    fft_multi(output + y, temp + y, n);
  }

  // Put the 0 and n/2 th results in the correct place.
  for (int x = 0; x < n; ++x) {
    output[x] = temp[x * n];
    output[(n / 2) * n + x] = temp[x * n + 1];
  }
  // This rearranges and transposes.
  for (int y = 1; y < n / 2; ++y) {
    // Fill in the real columns
    for (int x = 0; x <= n / 2; ++x) {
      output[x + y * n] =
          temp[(y + 1) + x * n] +
          ((x > 0 && x < n / 2) ? temp[(y + n / 2) + (x + n / 2) * n] : 0);
    }
    for (int x = n / 2 + 1; x < n; ++x) {
      output[x + y * n] = temp[(y + 1) + (n - x) * n] -
                          temp[(y + n / 2) + ((n - x) + n / 2) * n];
    }
    // Fill in the imag columns
    for (int x = 0; x <= n / 2; ++x) {
      output[x + (y + n / 2) * n] =
          temp[(y + n / 2) + x * n] -
          ((x > 0 && x < n / 2) ? temp[(y + 1) + (x + n / 2) * n] : 0);
    }
    for (int x = n / 2 + 1; x < n; ++x) {
      output[x + (y + n / 2) * n] = temp[(y + 1) + ((n - x) + n / 2) * n] +
                                    temp[(y + n / 2) + (n - x) * n];
    }
  }
  for (int y = 0; y < n; y += vec_size) {
    ifft_multi(output + y, temp + y, n);
  }
  transpose(temp, output, n);
}